

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O2

void qpdfjob_register_progress_reporter
               (qpdfjob_handle j,_func_void_int_void_ptr *report_progress,void *data)

{
  function<void_(int)> local_40;
  _Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)> local_20;
  
  local_20._M_f = report_progress;
  local_20._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_void_*>.
  super__Tuple_impl<1UL,_void_*>.super__Head_base<1UL,_void_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_void_*>)
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_void_*>)data;
  std::function<void(int)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,void*))(int,void*)>,void>
            ((function<void(int)> *)&local_40,&local_20);
  QPDFJob::registerProgressReporter(&j->j,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

void
qpdfjob_register_progress_reporter(
    qpdfjob_handle j, void (*report_progress)(int percent, void* data), void* data)
{
    j->j.registerProgressReporter(std::bind(report_progress, std::placeholders::_1, data));
}